

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O2

void __thiscall spvtools::opt::DistanceVector::DistanceVector(DistanceVector *this,size_t size)

{
  allocator_type local_29;
  value_type local_28;
  
  local_28.dependence_information = UNKNOWN;
  local_28.direction = ALL;
  local_28.distance = 0;
  local_28.peel_first = false;
  local_28.peel_last = false;
  local_28.point_x = 0;
  local_28.point_y = 0;
  std::vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>::vector
            (&this->entries,size,&local_28,&local_29);
  return;
}

Assistant:

explicit DistanceVector(size_t size) : entries(size, DistanceEntry{}) {}